

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussPoint.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChGaussPoint::ChGaussPoint
          (ChGaussPoint *this,int number,ChVector<double> *coord,double weight)

{
  Matrix<double,_1,_1,1,_1,_1> *this_00;
  int local_20;
  int local_1c;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->Strain);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->Stress);
  this->m_number = number;
  (this->m_local_coordinates).m_data[0] = coord->m_data[0];
  (this->m_local_coordinates).m_data[1] = coord->m_data[1];
  (this->m_local_coordinates).m_data[2] = coord->m_data[2];
  this->m_coordinates = (ChVector<double> *)0x0;
  this->m_weight = weight;
  this_00 = (Matrix<double,_1,_1,1,_1,_1> *)Eigen::internal::conditional_aligned_malloc<false>(0x18)
  ;
  local_20 = 1;
  local_1c = local_20;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>(this_00,&local_1c,&local_20);
  this->MatrB = (ChMatrixDynamic<> *)this_00;
  return;
}

Assistant:

ChGaussPoint::ChGaussPoint(int number, ChVector<>* coord, double weight)
    : m_number(number), m_local_coordinates(*coord), m_weight(weight), m_coordinates(nullptr) {
    MatrB = new ChMatrixDynamic<>(1, 1);
}